

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnRefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  Var *__s;
  Var VStack_68;
  
  __s = &VStack_68;
  this->expr_loc_ = loc;
  Var::Var(&VStack_68,func_var);
  RVar1 = CheckDeclaredFunc(this,&VStack_68);
  Var::~Var(&VStack_68);
  pcVar3 = Var::index(func_var,(char *)__s,__c);
  RVar2 = TypeChecker::OnRefFuncExpr(&this->typechecker_,(Index)pcVar3);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnRefFunc(const Location& loc, Var func_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckDeclaredFunc(func_var);
  result |= typechecker_.OnRefFuncExpr(func_var.index());
  return result;
}